

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall xLearn::Model::SetBestModel(Model *this)

{
  int iVar1;
  void *pvVar2;
  ostream *poVar3;
  char *in_RDI;
  bad_alloc *anon_var_0;
  int ret;
  Logger *in_stack_fffffffffffffea0;
  string *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int line;
  allocator *paVar4;
  LogSeverity severity;
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [48];
  Logger local_10;
  int local_c;
  
  line = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  if (*(long *)(in_RDI + 0x70) == 0) {
    pvVar2 = malloc((ulong)*(uint *)(in_RDI + 0x40) << 2);
    *(void **)(in_RDI + 0x70) = pvVar2;
  }
  if (*(long *)(in_RDI + 0x78) == 0) {
    iVar1 = std::__cxx11::string::compare(in_RDI);
    if (iVar1 != 0) {
      local_c = posix_memalign((void **)(in_RDI + 0x78),0x10,(ulong)*(uint *)(in_RDI + 0x44) << 2);
      if (local_c != 0) {
        Logger::Logger(&local_10,ERR);
        paVar4 = &local_41;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
                   ,paVar4);
        severity = (LogSeverity)((ulong)paVar4 >> 0x20);
        paVar4 = &local_69;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,"SetBestModel",paVar4);
        poVar3 = Logger::Start(severity,(string *)paVar4,line,in_stack_ffffffffffffff08);
        poVar3 = std::operator<<(poVar3,"CHECK_EQ failed ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x157);
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"ret");
        poVar3 = std::operator<<(poVar3," = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"0");
        poVar3 = std::operator<<(poVar3," = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
        std::__cxx11::string::~string(local_40);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
        Logger::~Logger(in_stack_fffffffffffffea0);
        abort();
      }
      local_c = 0;
    }
  }
  if (*(long *)(in_RDI + 0x80) == 0) {
    pvVar2 = malloc((ulong)*(uint *)(in_RDI + 0x54) << 2);
    *(void **)(in_RDI + 0x80) = pvVar2;
  }
  memcpy(*(void **)(in_RDI + 0x70),*(void **)(in_RDI + 0x58),(ulong)*(uint *)(in_RDI + 0x40) << 2);
  memcpy(*(void **)(in_RDI + 0x78),*(void **)(in_RDI + 0x60),(ulong)*(uint *)(in_RDI + 0x44) << 2);
  memcpy(*(void **)(in_RDI + 0x80),*(void **)(in_RDI + 0x68),(ulong)*(uint *)(in_RDI + 0x54) << 2);
  return;
}

Assistant:

void Model::SetBestModel() {
  try {
    if (param_best_w_ == nullptr) {
        param_best_w_ = (real_t*)malloc(
        param_num_w_*sizeof(real_t));
    }
    if (param_best_v_ == nullptr &&
        score_func_.compare("linear") != 0) {
  #ifdef _MSC_VER
        param_best_v_ = (decltype(param_best_v_))_aligned_malloc(
        param_num_v_ * sizeof(real_t),
        kAlignByte);
  #else
      int ret = posix_memalign(
                (void**)&param_best_v_,
                kAlignByte,
                param_num_v_ * sizeof(real_t));
      CHECK_EQ(ret, 0);
  #endif
    }
    if (param_best_b_ == nullptr) {
        param_best_b_ = (real_t*)malloc(
         aux_size_ * sizeof(real_t)
        );
    }
  } catch (std::bad_alloc&) {
    LOG(FATAL) << "Cannot allocate enough memory for current  \
                   model parameters. Parameter size: "
               << GetNumParameter();
  }
  // Copy current model parameters
  memcpy(param_best_w_, param_w_, param_num_w_*sizeof(real_t));
  memcpy(param_best_v_, param_v_, param_num_v_*sizeof(real_t));
  memcpy(param_best_b_, param_b_, aux_size_*sizeof(real_t));
}